

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O3

void convolve(int *c1,int *c2,int param_3)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  void *__ptr;
  long lVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  float fVar14;
  float in_stack_000004f8;
  uint in_stack_000004fc;
  float in_stack_000009f0;
  uint in_stack_000009f4;
  long local_70;
  long local_68;
  
  iVar3 = (int)in_stack_000009f4 / 2;
  param_3 = param_3 - iVar3;
  if (iVar3 < param_3) {
    iVar13 = c1[2];
    iVar10 = 0;
    local_68 = (long)iVar3;
    do {
      if (0 < iVar13) {
        uVar1 = c1[1];
        iVar12 = 0;
        do {
          if (0 < (int)uVar1) {
            lVar4 = *(long *)(c2 + (local_68 - iVar3) * 2 + 6);
            iVar2 = *c2;
            uVar8 = 0;
            do {
              if ((int)in_stack_000009f4 < 1) {
                fVar14 = 0.0;
              }
              else {
                fVar14 = 0.0;
                uVar11 = 0;
                do {
                  fVar14 = fVar14 + *(float *)(*(long *)(c1 + (long)(iVar10 + (int)uVar11) * 2 + 6)
                                              + ((long)*c1 * (long)iVar12 + uVar8) * 4) *
                                    *(float *)(&stack0x00000500 + uVar11 * 4);
                  uVar11 = uVar11 + 1;
                } while (in_stack_000009f4 != uVar11);
              }
              *(float *)(lVar4 + (uVar8 + (long)iVar2 * (long)iVar12) * 4) =
                   fVar14 / in_stack_000009f0;
              uVar8 = uVar8 + 1;
            } while (uVar8 != uVar1);
          }
          iVar12 = iVar12 + 1;
        } while (iVar12 != iVar13);
      }
      local_68 = local_68 + 1;
      iVar10 = iVar10 + 1;
    } while (local_68 != param_3);
    iVar13 = (int)in_stack_000004fc / 2;
    if (iVar3 < param_3) {
      iVar10 = c2[2];
      lVar4 = (long)iVar3;
      local_70 = lVar4;
      do {
        __ptr = malloc(0x61840);
        if (0 < iVar10) {
          lVar5 = (long)c2[1] - (long)iVar13;
          iVar3 = 0;
          do {
            if (iVar13 < (int)lVar5) {
              iVar12 = *c2 * iVar3;
              lVar7 = (long)iVar12;
              lVar9 = (long)iVar13;
              do {
                if ((int)in_stack_000004fc < 1) {
                  fVar14 = 0.0;
                }
                else {
                  fVar14 = 0.0;
                  uVar8 = 0;
                  do {
                    fVar14 = fVar14 + *(float *)(*(long *)(c2 + (local_70 - lVar4) * 2 + 6) +
                                                (long)(iVar12 + (int)uVar8) * 4) *
                                      *(float *)(&stack0x00000008 + uVar8 * 4);
                    uVar8 = uVar8 + 1;
                  } while (in_stack_000004fc != uVar8);
                }
                *(float *)((long)__ptr + (lVar9 + lVar7) * 4) = fVar14 / in_stack_000004f8;
                lVar9 = lVar9 + 1;
                iVar12 = iVar12 + 1;
              } while (lVar9 != lVar5);
            }
            iVar3 = iVar3 + 1;
          } while (iVar3 != iVar10);
        }
        if (iVar13 < iVar10 - iVar13) {
          uVar1 = c2[1];
          iVar12 = 0;
          iVar3 = iVar13;
          do {
            if (0 < (int)uVar1) {
              lVar5 = *(long *)(c2 + (local_70 - lVar4) * 2 + 6);
              iVar2 = *c2;
              uVar8 = 0;
              do {
                fVar14 = 0.0;
                if (0 < (int)in_stack_000004fc) {
                  uVar11 = 0;
                  iVar6 = iVar2 * iVar12;
                  do {
                    fVar14 = fVar14 + *(float *)((long)__ptr + (uVar8 + (long)iVar6) * 4) *
                                      *(float *)(&stack0x00000008 + uVar11 * 4);
                    uVar11 = uVar11 + 1;
                    iVar6 = iVar6 + iVar2;
                  } while (in_stack_000004fc != uVar11);
                }
                *(float *)(lVar5 + (uVar8 + (long)(iVar2 * iVar3)) * 4) = fVar14 / in_stack_000004f8
                ;
                uVar8 = uVar8 + 1;
              } while (uVar8 != uVar1);
            }
            iVar3 = iVar3 + 1;
            iVar12 = iVar12 + 1;
          } while (iVar3 != iVar10 - iVar13);
        }
        free(__ptr);
        local_70 = local_70 + 1;
      } while (local_70 != param_3);
    }
  }
  c2[4] = c2[4] + (int)in_stack_000004fc / 2;
  return;
}

Assistant:

void convolve(c1,c2,ker1,ker2,n)
qnode_ptr_t c1, c2 ;
kernel_t ker1, ker2 ;
int n ;

{ image512_t *t ;
  float s ;
  int i, j, k, l, h1, h2 ;

  h2 = ker2.m/2 ;

  for (k = h2 ; k < n - h2 ; k++) {
    for (i = 0 ; i < c1->sizy ; i++) {
      for (j = 0 ; j < c1->sizx ; j++) {
        s = 0.0 ;
        for (l = 0 ; l < ker2.m ; l++) {
          s += (*c1->gauss_ptr[l+k-h2])[c1->res*i + j]*ker2.k[l] ;
        }
        (*c2->gauss_ptr[k-h2])[c2->res*i + j] = s/ker2.f ;
      }
    }
  }

  h1 = ker1.m/2 ;

  for (k = h2 ; k < n - h2 ; k++) {

    t = (image512_t *)malloc(sizeof(image512_t)) ;

    for (i = 0 ; i < c2->sizy ; i++) {
      for (j = h1 ; j < c2->sizx - h1 ; j++) {
        s = 0.0 ;
        for (l = 0 ; l < ker1.m ; l++) {
          s += (*c2->gauss_ptr[k-h2])[c2->res*i + j+l-h1]*ker1.k[l] ;
        }
        (*t)[c2->res*i + j] = s/ker1.f ;
      }
    }

    for (i = h1 ; i < c2->sizy - h1 ; i++) {
      for (j = 0 ; j < c2->sizx ; j++) {
        s = 0.0 ;
        for (l = 0 ; l < ker1.m ; l++) {
          s += (*t)[c2->res*(i+l-h1) + j]*ker1.k[l] ;
        }
        (*c2->gauss_ptr[k-h2])[c2->res*i + j] = s/ker1.f ;
      }
    }
    free((image512_t *)t) ;
  }
  c2->ofst += h1 ;
}